

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_attribute.h
# Opt level: O1

bool __thiscall
winmd::reader::ElemSig::EnumValue::equals_enumerator(EnumValue *this,string_view *name)

{
  _Array_type *value;
  Field FVar1;
  bool __ret;
  pair<winmd::reader::Constant,_winmd::reader::Constant> range;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_build_O1_winmd_prefix_src_winmd_src_impl_winmd_reader_custom_attribute_h:49:50),_const_std::variant<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>_&>
  constant_value;
  undefined1 local_79;
  undefined1 local_78 [16];
  Constant local_68;
  pair<winmd::reader::Constant,_winmd::reader::Constant> local_58;
  variant<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
  local_38;
  
  FVar1 = EnumDefinition::get_enumerator(&this->type,name);
  value = &std::__detail::__variant::
           __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::variant<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/build_O1/winmd-prefix/src/winmd/src/impl/winmd_reader/custom_attribute.h:49:50)_&&,_const_std::variant<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>_&>
           ::_S_vtable;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::variant<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/build_O1/winmd-prefix/src/winmd/src/impl/winmd_reader/custom_attribute.h:49:50)_&&,_const_std::variant<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>_&>
    ::_S_vtable._M_arr
    [*(__index_type *)
      ((long)&(this->value).
              super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
              .
              super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
              .
              super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
              .
              super__Move_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
              .
              super__Copy_ctor_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
              .
              super__Variant_storage_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long>
      + 8)]._M_data)(&local_38,(anon_class_1_0_00000001 *)&local_58,&this->value);
  local_78._8_4_ = FVar1.super_row_base<winmd::reader::Field>.m_index * 4 + 4;
  local_78._0_8_ = (database *)FVar1.super_row_base<winmd::reader::Field>.m_table;
  equal_range<winmd::reader::table<winmd::reader::Constant>,winmd::reader::coded_index<winmd::reader::HasConstant>>
            (&local_58,
             (reader *)
             &((((database *)FVar1.super_row_base<winmd::reader::Field>.m_table)->TypeRef).
               super_table_base.m_database)->Constant,(table<winmd::reader::Constant> *)local_78,
             (coded_index<winmd::reader::HasConstant> *)value);
  local_68.super_row_base<winmd::reader::Constant>.m_table = (table_base *)0x0;
  local_68.super_row_base<winmd::reader::Constant>.m_index = 0;
  if (local_58.second.super_row_base<winmd::reader::Constant>.m_index !=
      local_58.first.super_row_base<winmd::reader::Constant>.m_index ||
      local_58.second.super_row_base<winmd::reader::Constant>.m_table !=
      local_58.first.super_row_base<winmd::reader::Constant>.m_table) {
    local_68.super_row_base<winmd::reader::Constant>.m_table =
         local_58.first.super_row_base<winmd::reader::Constant>.m_table;
    local_68.super_row_base<winmd::reader::Constant>.m_index =
         local_58.first.super_row_base<winmd::reader::Constant>.m_index;
  }
  Constant::Value((constant_type *)&local_58,&local_68);
  local_78._0_8_ = &local_79;
  local_79 = 1;
  local_78._8_8_ = &local_58;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:1232:3)_&&,_const_std::variant<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>_&>
    ::_S_vtable._M_arr
    [local_38.
     super__Variant_base<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>,_std::nullptr_t>
     .
     super__Move_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
     .
     super__Copy_assign_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
     .
     super__Move_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
     .
     super__Copy_ctor_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
     .
     super__Variant_storage_alias<bool,_char16_t,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::basic_string_view<char16_t>,_std::nullptr_t>
     ._M_index]._M_data)((anon_class_16_2_9763bfdf *)local_78,&local_38);
  return (bool)local_79;
}

Assistant:

bool equals_enumerator(std::string_view const& name) const
            {
                auto field = type.get_enumerator(name);
                auto constant_value = std::visit([](auto&& v) { return Constant::constant_type{ v }; }, value);
                return field.Constant().Value() == constant_value;
            }